

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O1

void google::protobuf::MapTestUtil::SetArenaMapFields<proto2_unittest::TestArenaMapLite>
               (TestArenaMapLite *message)

{
  MapFieldLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  void *pvVar1;
  void *this_00;
  size_type __dnew;
  NodeBase **local_110;
  NodeBase *local_108;
  NodeBase *local_100 [2];
  pair<google::protobuf::Map<int,_int>::iterator,_bool> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  void *local_b0;
  void *local_a8;
  Map<std::__cxx11::string,std::__cxx11::string> *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  anon_union_552_1_493b367e_for_TestArenaMapLite_3 *local_38;
  
  local_38 = &message->field_0;
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_38,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_40 = (void *)((long)&message->field_0 + 0x20);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_40,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_48 = (void *)((long)&message->field_0 + 0x40);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             local_48,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_50 = (void *)((long)&message->field_0 + 0x60);
  local_110 = (NodeBase **)0x0;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             local_50,(unsigned_long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_58 = (void *)((long)&message->field_0 + 0x80);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_58,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_60 = (void *)((long)&message->field_0 + 0xa0);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_60,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_68 = (void *)((long)&message->field_0 + 0xc0);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             local_68,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_70 = (void *)((long)&message->field_0 + 0xe0);
  local_110 = (NodeBase **)0x0;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             local_70,(unsigned_long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_78 = (void *)((long)&message->field_0 + 0x100);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_78,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_80 = (void *)((long)&message->field_0 + 0x120);
  local_110 = (NodeBase **)0x0;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_80,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_88 = (void *)((long)&message->field_0 + 0x140);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,float>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_float>::iterator,_bool> *)&local_f0,local_88,
             (int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0;
  local_90 = (void *)((long)&message->field_0 + 0x160);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,double>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_double>::iterator,_bool> *)&local_f0,local_90,
             (int *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x0;
  local_98 = (void *)((long)&message->field_0 + 0x180);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffffffffff00);
  Map<bool,bool>::TryEmplaceInternal<bool_const&>
            ((pair<google::protobuf::Map<bool,_bool>::iterator,_bool> *)&local_f0,local_98,
             (bool *)&local_110);
  *(undefined1 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 1) = 0;
  local_110 = local_100;
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x6c20797265762061;
  local_110[2] = (NodeBase *)0x6972747320676e6f;
  local_110[3] = (NodeBase *)0x207461687420676e;
  local_110[4] = (NodeBase *)0x206e692073656f67;
  local_110[5] = (NodeBase *)0x7061656820656874;
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_f0);
  this = &(message->field_0)._impl_.map_string_string_;
  local_d0.field_2._M_allocated_capacity = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  builtin_strncpy(local_d0._M_dataplus._M_p,"This is a very long string that goes in the heap",0x30)
  ;
  local_d0._M_string_length = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  local_d0._M_dataplus._M_p[(long)local_f0.first.super_UntypedMapIterator.node_] = '\0';
  Map<std::__cxx11::string,std::__cxx11::string>::TryEmplaceInternal<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,(Map<std::__cxx11::string,std::__cxx11::string> *)this,&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 5),(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000030;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x6c20797265762061;
  local_110[2] = (NodeBase *)0x6972747320676e6f;
  local_110[3] = (NodeBase *)0x207461687420676e;
  local_110[4] = (NodeBase *)0x206e692073656f67;
  local_110[5] = (NodeBase *)0x7061656820656874;
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  pvVar1 = (void *)((long)&message->field_0 + 0x1c0);
  local_d0._M_dataplus._M_p = local_d0._M_dataplus._M_p & 0xffffffff00000000;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pvVar1,(int *)&local_d0);
  local_a8 = pvVar1;
  local_a0 = (Map<std::__cxx11::string,std::__cxx11::string> *)this;
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 2),(string *)&local_110);
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_b0 = (void *)((long)&message->field_0 + 0x1e0);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,proto2_unittest::MapEnumLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::iterator,_bool> *)
             &local_f0,local_b0,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  this_00 = (void *)((long)&message->field_0 + 0x200);
  local_110 = (NodeBase **)((ulong)local_110 & 0xffffffff00000000);
  Map<int,proto2_unittest::ForeignMessageArenaLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::ForeignMessageArenaLite>::iterator,_bool>
              *)&local_f0,this_00,(int *)&local_110);
  *(undefined4 *)&local_f0.first.super_UntypedMapIterator.node_[5].next = 0;
  *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next =
       *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next | 1;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_38,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_40,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             local_48,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  local_110 = (NodeBase **)0x1;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             local_50,(unsigned_long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_58,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_60,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<unsigned_int,unsigned_int>::TryEmplaceInternal<unsigned_int_const&>
            ((pair<google::protobuf::Map<unsigned_int,_unsigned_int>::iterator,_bool> *)&local_f0,
             local_68,(uint *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  local_110 = (NodeBase **)0x1;
  Map<unsigned_long,unsigned_long>::TryEmplaceInternal<unsigned_long_const&>
            ((pair<google::protobuf::Map<unsigned_long,_unsigned_long>::iterator,_bool> *)&local_f0,
             local_70,(unsigned_long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,int>::TryEmplaceInternal<int_const&>(&local_f0,local_78,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 1;
  local_110 = (NodeBase **)0x1;
  Map<long,long>::TryEmplaceInternal<long_const&>
            ((pair<google::protobuf::Map<long,_long>::iterator,_bool> *)&local_f0,local_80,
             (long *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x1;
  local_110._0_4_ = 1;
  Map<int,float>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_float>::iterator,_bool> *)&local_f0,local_88,
             (int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 0x3f800000;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,double>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_double>::iterator,_bool> *)&local_f0,local_90,
             (int *)&local_110);
  local_f0.first.super_UntypedMapIterator.node_[2].next = (NodeBase *)0x3ff0000000000000;
  local_110 = (NodeBase **)CONCAT71(local_110._1_7_,1);
  Map<bool,bool>::TryEmplaceInternal<bool_const&>
            ((pair<google::protobuf::Map<bool,_bool>::iterator,_bool> *)&local_f0,local_98,
             (bool *)&local_110);
  *(undefined1 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 1) = 1;
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x20726568746f6e61;
  local_110[2] = (NodeBase *)0x6e6f6c2079726576;
  local_110[3] = (NodeBase *)0x676e697274732067;
  local_110[4] = (NodeBase *)0x6f67207461687420;
  local_110[5] = (NodeBase *)0x6874206e69207365;
  builtin_strncpy((char *)((long)local_110 + 0x2e),"the heap",8);
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_d0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_d0,(ulong)&local_f0);
  local_d0.field_2._M_allocated_capacity = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  builtin_strncpy(local_d0._M_dataplus._M_p,"This is another very long string that goes in the heap"
                  ,0x36);
  local_d0._M_string_length = (size_type)local_f0.first.super_UntypedMapIterator.node_;
  local_d0._M_dataplus._M_p[(long)local_f0.first.super_UntypedMapIterator.node_] = '\0';
  Map<std::__cxx11::string,std::__cxx11::string>::TryEmplaceInternal<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,local_a0,&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 5),(string *)&local_110);
  pvVar1 = local_a8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,(ulong)(local_d0.field_2._M_allocated_capacity + 1));
  }
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_f0.first.super_UntypedMapIterator.node_ = (NodeBase *)&DAT_00000036;
  local_110 = local_100;
  local_110 = (NodeBase **)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
  local_100[0] = local_f0.first.super_UntypedMapIterator.node_;
  *local_110 = (NodeBase *)0x2073692073696854;
  local_110[1] = (NodeBase *)0x20726568746f6e61;
  local_110[2] = (NodeBase *)0x6e6f6c2079726576;
  local_110[3] = (NodeBase *)0x676e697274732067;
  local_110[4] = (NodeBase *)0x6f67207461687420;
  local_110[5] = (NodeBase *)0x6874206e69207365;
  builtin_strncpy((char *)((long)local_110 + 0x2e),"the heap",8);
  local_108 = local_f0.first.super_UntypedMapIterator.node_;
  *(char *)((long)local_110 + (long)local_f0.first.super_UntypedMapIterator.node_) = '\0';
  local_d0._M_dataplus._M_p._0_4_ = 1;
  Map<int,std::__cxx11::string>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::iterator,_bool>
              *)&local_f0,pvVar1,(int *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)(local_f0.first.super_UntypedMapIterator.node_ + 2),(string *)&local_110);
  if (local_110 != local_100) {
    operator_delete(local_110,(ulong)((long)&local_100[0]->next + 1));
  }
  local_110._0_4_ = 1;
  Map<int,proto2_unittest::MapEnumLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>::iterator,_bool> *)
             &local_f0,local_b0,(int *)&local_110);
  *(undefined4 *)((long)&local_f0.first.super_UntypedMapIterator.node_[1].next + 4) = 2;
  local_110 = (NodeBase **)CONCAT44(local_110._4_4_,1);
  Map<int,proto2_unittest::ForeignMessageArenaLite>::TryEmplaceInternal<int_const&>
            ((pair<google::protobuf::Map<int,_proto2_unittest::ForeignMessageArenaLite>::iterator,_bool>
              *)&local_f0,this_00,(int *)&local_110);
  *(undefined4 *)&local_f0.first.super_UntypedMapIterator.node_[5].next = 1;
  *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next =
       *(byte *)&local_f0.first.super_UntypedMapIterator.node_[4].next | 1;
  return;
}

Assistant:

void MapTestUtil::SetArenaMapFields(TestArenaMap* message) {
  // Add first element.
  (*message->mutable_map_int32_int32())[0] = 0;
  (*message->mutable_map_int64_int64())[0] = 0;
  (*message->mutable_map_uint32_uint32())[0] = 0;
  (*message->mutable_map_uint64_uint64())[0] = 0;
  (*message->mutable_map_sint32_sint32())[0] = 0;
  (*message->mutable_map_sint64_sint64())[0] = 0;
  (*message->mutable_map_fixed32_fixed32())[0] = 0;
  (*message->mutable_map_fixed64_fixed64())[0] = 0;
  (*message->mutable_map_sfixed32_sfixed32())[0] = 0;
  (*message->mutable_map_sfixed64_sfixed64())[0] = 0;
  (*message->mutable_map_int32_float())[0] = 0.0;
  (*message->mutable_map_int32_double())[0] = 0.0;
  (*message->mutable_map_bool_bool())[0] = false;
  (*message->mutable_map_string_string())[long_string()] = long_string();
  (*message->mutable_map_int32_bytes())[0] = long_string();
  (*message->mutable_map_int32_enum())[0] = MapEnum_BAR<TestArenaMap>();
  (*message->mutable_map_int32_foreign_message())[0].set_c(0);

  // Add second element
  (*message->mutable_map_int32_int32())[1] = 1;
  (*message->mutable_map_int64_int64())[1] = 1;
  (*message->mutable_map_uint32_uint32())[1] = 1;
  (*message->mutable_map_uint64_uint64())[1] = 1;
  (*message->mutable_map_sint32_sint32())[1] = 1;
  (*message->mutable_map_sint64_sint64())[1] = 1;
  (*message->mutable_map_fixed32_fixed32())[1] = 1;
  (*message->mutable_map_fixed64_fixed64())[1] = 1;
  (*message->mutable_map_sfixed32_sfixed32())[1] = 1;
  (*message->mutable_map_sfixed64_sfixed64())[1] = 1;
  (*message->mutable_map_int32_float())[1] = 1.0;
  (*message->mutable_map_int32_double())[1] = 1.0;
  (*message->mutable_map_bool_bool())[1] = true;
  (*message->mutable_map_string_string())[long_string_2()] = long_string_2();
  (*message->mutable_map_int32_bytes())[1] = long_string_2();
  (*message->mutable_map_int32_enum())[1] = MapEnum_BAZ<TestArenaMap>();
  (*message->mutable_map_int32_foreign_message())[1].set_c(1);
}